

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::STEP::EXPRESS::LIST>
Assimp::STEP::EXPRESS::LIST::Parse(char **inout,uint64_t line,ConversionSchema *schema)

{
  char cVar1;
  element_type *peVar2;
  char *c;
  char *pcVar3;
  SyntaxError *pSVar4;
  ConversionSchema *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in;
  size_type __n;
  shared_ptr<const_Assimp::STEP::EXPRESS::LIST> sVar5;
  allocator<char> local_81;
  char *local_80;
  ConversionSchema *local_78;
  string local_70;
  undefined8 *local_50;
  element_type *local_48;
  shared_ptr<Assimp::STEP::EXPRESS::LIST> list;
  
  local_78 = schema;
  local_48 = (element_type *)inout;
  std::make_shared<Assimp::STEP::EXPRESS::LIST>();
  in = *(char **)line + 1;
  local_80 = in;
  local_50 = (undefined8 *)line;
  if (**(char **)line != '(') {
    pSVar4 = (SyntaxError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"unexpected token, expected \'(\' token at beginning of list",
               &local_81);
    SyntaxError::SyntaxError(pSVar4,&local_70,(uint64_t)local_78);
    __cxa_throw(pSVar4,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
  }
  __n = 1;
  pcVar3 = in;
  while( true ) {
    cVar1 = *pcVar3;
    if ((cVar1 == ')') || (cVar1 == '\0')) break;
    __n = __n + (cVar1 == ',');
    pcVar3 = pcVar3 + 1;
  }
  std::
  vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
  ::reserve(&(list.super___shared_ptr<Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->members,__n);
  while( true ) {
    if (*in == '\0') {
      pSVar4 = (SyntaxError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"unexpected end of line while reading list",&local_81);
      SyntaxError::SyntaxError(pSVar4,&local_70,0xffffffffffffffff);
      __cxa_throw(pSVar4,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
    }
    SkipSpaces<char>(in,&local_80);
    if (*local_80 == ')') break;
    DataType::Parse((DataType *)&local_70,&local_80,(uint64_t)local_78,in_RCX);
    std::
    vector<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>,std::allocator<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>>
    ::emplace_back<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>
              ((vector<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>,std::allocator<std::shared_ptr<Assimp::STEP::EXPRESS::DataType_const>>>
                *)&(list.super___shared_ptr<Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->members,(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&local_70)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_string_length);
    SkipSpaces<char>(local_80,&local_80);
    if (*local_80 != ',') {
      if (*local_80 != ')') {
        pSVar4 = (SyntaxError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   "unexpected token, expected \',\' or \')\' token after list element",&local_81);
        SyntaxError::SyntaxError(pSVar4,&local_70,(uint64_t)local_78);
        __cxa_throw(pSVar4,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
      }
      break;
    }
    in = local_80 + 1;
    local_80 = in;
  }
  peVar2 = local_48;
  *local_50 = local_80 + 1;
  std::__shared_ptr<Assimp::STEP::EXPRESS::LIST_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Assimp::STEP::EXPRESS::LIST,void>
            ((__shared_ptr<Assimp::STEP::EXPRESS::LIST_const,(__gnu_cxx::_Lock_policy)2> *)local_48,
             &list.super___shared_ptr<Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&list.super___shared_ptr<Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar5.super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar5.super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  return (shared_ptr<const_Assimp::STEP::EXPRESS::LIST>)
         sVar5.super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const EXPRESS::LIST> EXPRESS::LIST::Parse(const char*& inout,uint64_t line, const EXPRESS::ConversionSchema* schema /*= NULL*/) {
    const std::shared_ptr<EXPRESS::LIST> list = std::make_shared<EXPRESS::LIST>();
    EXPRESS::LIST::MemberList& members = list->members;

    const char* cur = inout;
    if (*cur++ != '(') {
        throw STEP::SyntaxError("unexpected token, expected \'(\' token at beginning of list",line);
    }

    // estimate the number of items upfront - lists can grow large
    size_t count = 1;
    for(const char* c=cur; *c && *c != ')'; ++c) {
        count += (*c == ',' ? 1 : 0);
    }

    members.reserve(count);

    for(;;++cur) {
        if (!*cur) {
            throw STEP::SyntaxError("unexpected end of line while reading list");
        }
        SkipSpaces(cur,&cur);
        if (*cur == ')') {
            break;
        }

        members.push_back( EXPRESS::DataType::Parse(cur,line,schema));
        SkipSpaces(cur,&cur);

        if (*cur != ',') {
            if (*cur == ')') {
                break;
            }
            throw STEP::SyntaxError("unexpected token, expected \',\' or \')\' token after list element",line);
        }
    }

    inout = cur+1;
    return list;
}